

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_step(sqlite3_stmt *pStmt)

{
  int iVar1;
  Mem *p;
  ushort uVar2;
  undefined2 uVar3;
  uint uVar4;
  sqlite3 *db;
  sqlite3 *db_00;
  sqlite3 *db_01;
  uint *puVar5;
  Btree *p_00;
  Wal *pWVar6;
  sqlite3_stmt sVar7;
  char cVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  undefined4 uVar12;
  int iVar13;
  byte *pbVar14;
  undefined8 *puVar15;
  short *psVar16;
  uchar *z;
  char *pcVar17;
  ulong uVar18;
  char *pcVar19;
  int iVar20;
  ulong uVar21;
  undefined8 uVar22;
  byte bVar23;
  int iVar24;
  u32 uVar25;
  Mem *pMem;
  sqlite3_stmt *psVar26;
  byte *pbVar27;
  long val;
  ulong uVar28;
  long lVar29;
  int i;
  long lVar30;
  long lVar31;
  long in_FS_OFFSET;
  bool bVar32;
  int rc;
  int local_9c;
  StrAccum local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar9 = vdbeSafetyNotNull((Vdbe *)pStmt);
  if (iVar9 == 0) {
    db = *(sqlite3 **)pStmt;
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
    }
    local_9c = 0;
LAB_00120724:
    uVar10 = 1;
    db_00 = *(sqlite3 **)pStmt;
    sVar7 = pStmt[199];
    if (sVar7 != (sqlite3_stmt)0x2) {
      while (sVar7 == (sqlite3_stmt)0x3) {
        sqlite3_reset(pStmt);
        sVar7 = pStmt[199];
      }
      if (sVar7 != (sqlite3_stmt)0x1) goto LAB_0012080a;
      if (((byte)pStmt[200] & 3) == 0) {
        iVar9 = db_00->nVdbeActive;
        if (iVar9 == 0) {
          (db_00->u1).isInterrupted = 0;
        }
        if ((((db_00->mTrace & 0x82) != 0) && ((db_00->init).busy == '\0')) &&
           (*(long *)(pStmt + 0xf8) != 0)) {
          sqlite3OsCurrentTimeInt64(db_00->pVfs,(sqlite3_int64 *)(pStmt + 0xb8));
          iVar9 = db_00->nVdbeActive;
        }
        db_00->nVdbeActive = iVar9 + 1;
        cVar8 = (char)*(ushort *)(pStmt + 200);
        if ((*(ushort *)(pStmt + 200) & 0x40) == 0) {
          db_00->nVdbeWrite = db_00->nVdbeWrite + 1;
          cVar8 = (char)*(undefined2 *)(pStmt + 200);
        }
        if (cVar8 < '\0') {
          db_00->nVdbeRead = db_00->nVdbeRead + 1;
        }
        *(undefined4 *)(pStmt + 0x30) = 0;
        pStmt[199] = (sqlite3_stmt)0x2;
        goto LAB_0012080a;
      }
      *(undefined4 *)(pStmt + 0x34) = 0x11;
      if ((char)pStmt[0xc6] < '\0') {
        uVar10 = sqlite3VdbeTransferError((Vdbe *)pStmt);
      }
      goto LAB_00121053;
    }
LAB_0012080a:
    if ((*(ushort *)(pStmt + 200) & 0xc) == 0) {
      db_00->nVdbeExec = db_00->nVdbeExec + 1;
      uVar10 = sqlite3VdbeExec((Vdbe *)pStmt);
      db_00->nVdbeExec = db_00->nVdbeExec + -1;
      if (uVar10 != 100) goto LAB_00120f1d;
      goto LAB_001210fc;
    }
    db_01 = *(sqlite3 **)pStmt;
    bVar23 = 1;
    if ((*(ushort *)(pStmt + 200) & 0xc) != 4) {
      bVar23 = *(byte *)((long)&db_01->flags + 3) & 1;
    }
    lVar29 = *(long *)(pStmt + 0x68);
    p = (Mem *)(lVar29 + 0x38);
    releaseMemArray(p,8);
    if (*(int *)(pStmt + 0x34) == 7) {
      sqlite3OomFault(db_01);
      goto LAB_00120f1d;
    }
    if (bVar23 == 0) {
      pMem = (Mem *)0x0;
    }
    else {
      pMem = (Mem *)(*(long *)(pStmt + 0x68) + 0x1f8);
    }
    iVar9 = *(int *)(pStmt + 0x90);
    if (pMem == (Mem *)0x0) {
      uVar28 = 0;
      pcVar17 = (char *)0x0;
    }
    else {
      if ((pMem->flags & 0x10) == 0) {
        uVar28 = 0;
        pcVar17 = (char *)0x0;
      }
      else {
        uVar28 = (ulong)(uint)(pMem->n >> 3);
        pcVar17 = pMem->z;
      }
      uVar18 = 0;
      if (0 < (int)uVar28) {
        uVar18 = uVar28;
      }
      for (uVar21 = 0; uVar18 != uVar21; uVar21 = uVar21 + 1) {
        iVar9 = iVar9 + *(int *)(*(long *)(pcVar17 + uVar21 * 8) + 8);
      }
    }
    uVar2 = *(ushort *)(pStmt + 200);
    iVar13 = *(int *)(pStmt + 0x30);
    do {
      iVar1 = iVar13 + 1;
      if (iVar9 <= iVar13) {
        *(undefined4 *)(pStmt + 0x34) = 0;
        uVar10 = 0x65;
LAB_00120b19:
        *(int *)(pStmt + 0x30) = iVar1;
        goto LAB_00120f1d;
      }
      pcVar19 = pcVar17;
      psVar26 = pStmt + 0x88;
      iVar20 = iVar13;
      iVar24 = iVar13 - *(int *)(pStmt + 0x90);
      if (*(int *)(pStmt + 0x90) <= iVar13) {
        while( true ) {
          iVar20 = iVar24;
          psVar26 = *(sqlite3_stmt **)pcVar19;
          if (iVar20 < *(int *)(psVar26 + 8)) break;
          pcVar19 = pcVar19 + 8;
          iVar24 = iVar20 - *(int *)(psVar26 + 8);
        }
      }
      lVar31 = *(long *)psVar26;
      val = (long)iVar20;
      if ((pMem != (Mem *)0x0) && (*(char *)(lVar31 + 1 + val * 0x18) == -4)) {
        lVar30 = val * 0x18 + lVar31;
        iVar20 = (int)uVar28;
        iVar24 = iVar20 * 8 + 8;
        uVar18 = 0;
        if (0 < iVar20) {
          uVar18 = uVar28;
        }
        for (uVar21 = 0; uVar18 != uVar21; uVar21 = uVar21 + 1) {
          if (*(long *)(pcVar17 + uVar21 * 8) == *(long *)(lVar30 + 0x10)) {
            uVar18 = uVar21 & 0xffffffff;
            break;
          }
        }
        if ((int)uVar18 == iVar20) {
          iVar11 = sqlite3VdbeMemGrow(pMem,iVar24,(uint)(iVar20 != 0));
          *(int *)(pStmt + 0x34) = iVar11;
          if (iVar11 != 0) {
            uVar10 = 1;
            goto LAB_00120b19;
          }
          pcVar17 = pMem->z;
          *(undefined8 *)(pcVar17 + (long)iVar20 * 8) = *(undefined8 *)(lVar30 + 0x10);
          uVar3 = pMem->flags;
          pMem->flags = uVar3 & 0xf240 | 0x10;
          pMem->n = iVar24;
          iVar9 = iVar9 + *(int *)(*(long *)(lVar30 + 0x10) + 8);
          uVar28 = (ulong)(iVar20 + 1);
        }
      }
      uVar10 = 1;
    } while ((((uVar2 & 0xc) == 8) && (cVar8 = *(char *)(lVar31 + val * 0x18), cVar8 != -0x44)) &&
            ((bVar32 = iVar13 < 1, iVar13 = iVar1, bVar32 || (cVar8 != '\b'))));
    *(int *)(pStmt + 0x30) = iVar1;
    if ((db_01->u1).isInterrupted != 0) {
      *(undefined4 *)(pStmt + 0x34) = 9;
      sqlite3VdbeError((Vdbe *)pStmt,"interrupted");
      goto LAB_00120f1d;
    }
    pbVar27 = (byte *)(lVar31 + val * 0x18);
    local_58.nChar = 0;
    local_58.accError = '\0';
    local_58.printfFlags = '\0';
    local_58._30_2_ = 0xaaaa;
    local_58.db = (sqlite3 *)0x0;
    local_58.zText = (char *)0x0;
    local_58.nAlloc = 0;
    local_58.mxAlloc = 1000000000;
    pcVar17 = "program";
    switch(pbVar27[1]) {
    case 0xef:
      sqlite3_str_appendf(&local_58,"subrtnsig:%d,%s",(ulong)**(uint **)(pbVar27 + 0x10),
                          *(undefined8 *)(*(uint **)(pbVar27 + 0x10) + 2));
      break;
    default:
      pbVar14 = pbVar27 + 0x10;
      goto LAB_00120da2;
    case 0xf1:
      psVar16 = *(short **)(*(long *)(pbVar27 + 0x10) + 8);
      goto LAB_00120caf;
    case 0xf2:
      puVar5 = *(uint **)(pbVar27 + 0x10);
      uVar4 = *puVar5;
      for (; uVar10 <= uVar4; uVar10 = uVar10 + 1) {
        uVar22 = 0x2c;
        if (uVar10 == 1) {
          uVar22 = 0x5b;
        }
        sqlite3_str_appendf(&local_58,"%c%u",uVar22,(ulong)puVar5[uVar10]);
      }
      sqlite3_str_append(&local_58,"]",1);
      break;
    case 0xf3:
      puVar15 = *(undefined8 **)(pbVar27 + 0x10);
LAB_00120c88:
      uVar22 = *puVar15;
      pcVar17 = "%lld";
      goto LAB_00120c97;
    case 0xf4:
      puVar15 = *(undefined8 **)(pbVar27 + 0x10);
LAB_00120b93:
      sqlite3_str_appendf(&local_58,"%.16g",(int)*puVar15);
      break;
    case 0xf5:
      uVar22 = *(undefined8 *)(*(long *)(pbVar27 + 0x10) + 0x10);
      pcVar17 = "vtab:%p";
LAB_00120c97:
      sqlite3_str_appendf(&local_58,pcVar17,uVar22);
      break;
    case 0xf6:
      puVar15 = *(undefined8 **)(pbVar27 + 0x10);
      uVar2 = *(ushort *)((long)puVar15 + 0x14);
      if ((uVar2 & 2) != 0) {
        pbVar14 = (byte *)(puVar15 + 1);
        goto LAB_00120da2;
      }
      if ((uVar2 & 0x24) != 0) goto LAB_00120c88;
      if ((uVar2 & 8) != 0) goto LAB_00120b93;
      pcVar17 = "NULL";
      if ((uVar2 & 1) == 0) {
        pcVar17 = "(blob)";
      }
    case 0xfc:
switchD_00120ae4_caseD_fc:
      sqlite3_str_appendall(&local_58,pcVar17);
      break;
    case 0xf8:
      lVar31 = *(long *)(pbVar27 + 0x10);
      sqlite3_str_appendf(&local_58,"k(%d",(ulong)*(ushort *)(lVar31 + 6));
      for (uVar28 = 0; uVar28 < *(ushort *)(lVar31 + 6); uVar28 = uVar28 + 1) {
        puVar15 = *(undefined8 **)(lVar31 + 0x20 + uVar28 * 8);
        pcVar17 = "";
        if (puVar15 != (undefined8 *)0x0) {
          pcVar17 = (char *)*puVar15;
        }
        strcmp(pcVar17,"BINARY");
        bVar23 = *(byte *)(*(long *)(lVar31 + 0x18) + uVar28);
        pcVar17 = "-";
        if ((bVar23 & 1) == 0) {
          pcVar17 = "";
        }
        pcVar19 = "N.";
        if ((bVar23 & 2) == 0) {
          pcVar19 = "";
        }
        sqlite3_str_appendf(&local_58,",%s%s%s",pcVar17,pcVar19);
      }
      sqlite3_str_append(&local_58,")",1);
      break;
    case 0xf9:
      psVar16 = *(short **)(pbVar27 + 0x10);
LAB_00120caf:
      sqlite3_str_appendf(&local_58,"%s(%d)",*(undefined8 *)(psVar16 + 0x1c),
                          (ulong)(uint)(int)*psVar16);
      break;
    case 0xfb:
      pbVar14 = *(byte **)(pbVar27 + 0x10);
LAB_00120da2:
      pcVar17 = *(char **)pbVar14;
      if (pcVar17 != (char *)0x0) goto switchD_00120ae4_caseD_fc;
      break;
    case 0xfd:
      sqlite3_str_appendf(&local_58,"%d",(ulong)*(uint *)(pbVar27 + 0x10));
      break;
    case 0xfe:
      sqlite3_str_appendf(&local_58,"%.18s-%s",**(undefined8 **)(pbVar27 + 0x10),
                          sqlite3VdbeDisplayP4_encnames_rel +
                          *(int *)(sqlite3VdbeDisplayP4_encnames_rel +
                                  (ulong)*(byte *)(*(undefined8 **)(pbVar27 + 0x10) + 1) * 4));
    }
    if ((local_58._24_8_ & 0x700000000) != 0) {
      sqlite3OomFault(db_01);
    }
    pcVar17 = sqlite3StrAccumFinish(&local_58);
    if ((*(ushort *)(pStmt + 200) & 0xc) == 8) {
      sqlite3VdbeMemSetInt64(p,(long)*(int *)(pbVar27 + 4));
      sqlite3VdbeMemSetInt64((Mem *)(lVar29 + 0x70),(long)*(int *)(pbVar27 + 8));
      sqlite3VdbeMemSetInt64((Mem *)(lVar29 + 0xa8),(long)*(int *)(pbVar27 + 0xc));
      lVar31 = 0xe0;
    }
    else {
      sqlite3VdbeMemSetInt64(p,val);
      sqlite3VdbeMemSetStr
                ((Mem *)(lVar29 + 0x70),
                 sqlite3OpcodeName_azName_rel +
                 *(int *)(sqlite3OpcodeName_azName_rel + (ulong)*pbVar27 * 4),-1,'\x01',
                 (_func_void_void_ptr *)0x0);
      sqlite3VdbeMemSetInt64((Mem *)(lVar29 + 0xa8),(long)*(int *)(pbVar27 + 4));
      sqlite3VdbeMemSetInt64((Mem *)(lVar29 + 0xe0),(long)*(int *)(pbVar27 + 8));
      sqlite3VdbeMemSetInt64((Mem *)(lVar29 + 0x118),(long)*(int *)(pbVar27 + 0xc));
      sqlite3VdbeMemSetInt64((Mem *)(lVar29 + 0x188),(ulong)*(ushort *)(pbVar27 + 2));
      sqlite3VdbeMemSetNull((Mem *)(lVar29 + 0x1c0));
      lVar31 = 0x150;
    }
    sqlite3VdbeMemSetStr((Mem *)(lVar29 + lVar31),pcVar17,-1,'\x01',sqlite3_free);
    *(Mem **)(pStmt + 0xa0) = p;
    bVar32 = db_01->mallocFailed == '\0';
    uVar12 = 7;
    if (bVar32) {
      uVar12 = 0;
    }
    *(undefined4 *)(pStmt + 0x34) = uVar12;
    uVar10 = 1;
    if (bVar32) {
LAB_001210fc:
      db_00->errCode = 100;
      uVar10 = 100;
      goto LAB_00121107;
    }
LAB_00120f1d:
    if (0 < *(long *)(pStmt + 0xb8)) {
      invokeProfileCallback(db_00,(Vdbe *)pStmt);
    }
    *(undefined8 *)(pStmt + 0xa0) = 0;
    if (uVar10 == 0x65) {
      uVar10 = 0x65;
      if (db_00->autoCommit != '\0') {
        lVar29 = 0;
        iVar9 = 0;
        for (lVar31 = 0; lVar31 < db_00->nDb; lVar31 = lVar31 + 1) {
          p_00 = *(Btree **)((long)&db_00->aDb->pBt + lVar29);
          if (p_00 != (Btree *)0x0) {
            sqlite3BtreeEnter(p_00);
            pWVar6 = p_00->pBt->pPager->pWal;
            if (pWVar6 == (Wal *)0x0) {
              uVar25 = 0;
            }
            else {
              uVar25 = pWVar6->iCallback;
              pWVar6->iCallback = 0;
            }
            sqlite3BtreeLeave(p_00);
            if (((0 < (int)uVar25) &&
                (db_00->xWalCallback != (_func_int_void_ptr_sqlite3_ptr_char_ptr_int *)0x0)) &&
               (iVar9 == 0)) {
              iVar9 = (*db_00->xWalCallback)
                                (db_00->pWalArg,db_00,
                                 *(char **)((long)&db_00->aDb->zDbSName + lVar29),uVar25);
            }
          }
          lVar29 = lVar29 + 0x20;
        }
        *(int *)(pStmt + 0x34) = iVar9;
        uVar10 = 1;
        if (iVar9 == 0) {
          uVar10 = 0x65;
        }
      }
    }
    else if ((char)pStmt[0xc6] < '\0') {
      uVar10 = sqlite3VdbeTransferError((Vdbe *)pStmt);
    }
    db_00->errCode = uVar10;
    iVar9 = sqlite3ApiExit(*(sqlite3 **)pStmt,*(int *)(pStmt + 0x34));
    if ((iVar9 == 7) && (*(undefined4 *)(pStmt + 0x34) = 7, (char)pStmt[0xc6] < '\0')) {
      uVar10 = 7;
    }
LAB_00121053:
    uVar10 = uVar10 & db_00->errMask;
    if (uVar10 != 0x11) goto LAB_00121107;
    if (local_9c == 0x32) {
      uVar10 = 0x11;
      goto LAB_00121107;
    }
    iVar9 = *(int *)(pStmt + 0x30);
    iVar13 = sqlite3Reprepare((Vdbe *)pStmt);
    if (iVar13 == 0) {
      local_9c = local_9c + 1;
      sqlite3_reset(pStmt);
      if (-1 < iVar9) {
        pStmt[0xc5] = (sqlite3_stmt)0xfe;
      }
      goto LAB_00120724;
    }
    z = sqlite3_value_text(db->pErr);
    sqlite3DbFree(db,*(void **)(pStmt + 0xa8));
    if (db->mallocFailed == '\0') {
      pcVar17 = sqlite3DbStrDup(db,(char *)z);
      *(char **)(pStmt + 0xa8) = pcVar17;
      uVar10 = sqlite3ApiExit(db,iVar13);
      *(uint *)(pStmt + 0x34) = uVar10;
    }
    else {
      *(undefined8 *)(pStmt + 0xa8) = 0;
      *(undefined4 *)(pStmt + 0x34) = 7;
      uVar10 = 7;
    }
LAB_00121107:
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return uVar10;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    iVar9 = sqlite3MisuseError(0x165a9);
    return iVar9;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_API int sqlite3_step(sqlite3_stmt *pStmt){
  int rc = SQLITE_OK;      /* Result from sqlite3Step() */
  Vdbe *v = (Vdbe*)pStmt;  /* the prepared statement */
  int cnt = 0;             /* Counter to prevent infinite loop of reprepares */
  sqlite3 *db;             /* The database connection */

  if( vdbeSafetyNotNull(v) ){
    return SQLITE_MISUSE_BKPT;
  }
  db = v->db;
  sqlite3_mutex_enter(db->mutex);
  while( (rc = sqlite3Step(v))==SQLITE_SCHEMA
         && cnt++ < SQLITE_MAX_SCHEMA_RETRY ){
    int savedPc = v->pc;
    rc = sqlite3Reprepare(v);
    if( rc!=SQLITE_OK ){
      /* This case occurs after failing to recompile an sql statement.
      ** The error message from the SQL compiler has already been loaded
      ** into the database handle. This block copies the error message
      ** from the database handle into the statement and sets the statement
      ** program counter to 0 to ensure that when the statement is
      ** finalized or reset the parser error message is available via
      ** sqlite3_errmsg() and sqlite3_errcode().
      */
      const char *zErr = (const char *)sqlite3_value_text(db->pErr);
      sqlite3DbFree(db, v->zErrMsg);
      if( !db->mallocFailed ){
        v->zErrMsg = sqlite3DbStrDup(db, zErr);
        v->rc = rc = sqlite3ApiExit(db, rc);
      } else {
        v->zErrMsg = 0;
        v->rc = rc = SQLITE_NOMEM_BKPT;
      }
      break;
    }
    sqlite3_reset(pStmt);
    if( savedPc>=0 ){
      /* Setting minWriteFileFormat to 254 is a signal to the OP_Init and
      ** OP_Trace opcodes to *not* perform SQLITE_TRACE_STMT because it has
      ** already been done once on a prior invocation that failed due to
      ** SQLITE_SCHEMA.   tag-20220401a  */
      v->minWriteFileFormat = 254;
    }
    assert( v->expired==0 );
  }
  sqlite3_mutex_leave(db->mutex);
  return rc;
}